

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O1

void tabread4_float(t_tabread4 *x,t_float f)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  _garray *x_00;
  _outlet *x_01;
  t_float f_00;
  float fVar5;
  t_word *vec;
  int npoints;
  t_word *local_18;
  t_float local_10;
  int local_c;
  
  local_10 = f;
  x_00 = (_garray *)pd_findbyclass(x->x_arrayname,garray_class);
  if (x_00 != (_garray *)0x0) {
    iVar4 = garray_getfloatwords(x_00,&local_c,&local_18);
    if (iVar4 == 0) {
      pd_error(x,"%s: bad template for tabread4",x->x_arrayname->s_name);
    }
    else {
      if (local_c < 4) {
        x_01 = (x->x_obj).te_outlet;
        f_00 = 0.0;
      }
      else if (local_10 <= 1.0) {
        x_01 = (x->x_obj).te_outlet;
        f_00 = local_18[1].w_float;
      }
      else {
        uVar1 = local_c - 2;
        if ((float)(int)uVar1 <= local_10) {
          x_01 = (x->x_obj).te_outlet;
          f_00 = local_18[uVar1].w_float;
        }
        else {
          iVar4 = local_c + -3;
          if ((int)local_10 < (int)uVar1) {
            iVar4 = (int)local_10;
          }
          fVar5 = local_10 - (float)iVar4;
          fVar2 = local_18[(long)iVar4 + -1].w_float;
          fVar3 = local_18[iVar4].w_float;
          x_01 = (x->x_obj).te_outlet;
          f_00 = ((1.0 - fVar5) * -0.1666667 *
                  (((local_18[(long)iVar4 + 1].w_float - fVar3) * -3.0 +
                   (local_18[(long)iVar4 + 2].w_float - fVar2)) * fVar5 +
                  fVar3 * -3.0 + fVar2 + fVar2 + local_18[(long)iVar4 + 2].w_float) +
                 (local_18[(long)iVar4 + 1].w_float - fVar3)) * fVar5 + fVar3;
        }
      }
      outlet_float(x_01,f_00);
    }
    return;
  }
  pd_error(x,"%s: no such array",x->x_arrayname->s_name);
  return;
}

Assistant:

static void tabread4_float(t_tabread4 *x, t_float f)
{
    t_garray *a;
    int npoints;
    t_word *vec;

    if (!(a = (t_garray *)pd_findbyclass(x->x_arrayname, garray_class)))
        pd_error(x, "%s: no such array", x->x_arrayname->s_name);
    else if (!garray_getfloatwords(a, &npoints, &vec))
        pd_error(x, "%s: bad template for tabread4", x->x_arrayname->s_name);
    else if (npoints < 4)
        outlet_float(x->x_obj.ob_outlet, 0);
    else if (f <= 1)
        outlet_float(x->x_obj.ob_outlet, vec[1].w_float);
    else if (f >= npoints - 2)
        outlet_float(x->x_obj.ob_outlet, vec[npoints - 2].w_float);
    else
    {
        int n = f;
        float a, b, c, d, cminusb, frac;
        t_word *wp;
        if (n >= npoints - 2)
            n = npoints - 3;
        wp = vec + n;
        frac = f - n;
        a = wp[-1].w_float;
        b = wp[0].w_float;
        c = wp[1].w_float;
        d = wp[2].w_float;
        cminusb = c-b;
        outlet_float(x->x_obj.ob_outlet, b + frac * (
            cminusb - 0.1666667f * (1.-frac) * (
                (d - a - 3.0f * cminusb) * frac + (d + 2.0f*a - 3.0f*b))));
    }
}